

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CentralizedFileFormat.cpp
# Opt level: O0

void __thiscall ser::CentralizedFileFormat::WriteTables(CentralizedFileFormat *this,string *param_1)

{
  char *pcVar1;
  ostream *poVar2;
  json_string local_268;
  ostream local_248 [8];
  ofstream fs;
  JSONNode local_48;
  JSONNode mainNode;
  JSONNode offsetTableNode;
  undefined1 local_28 [8];
  JSONNode fieldsTableNode;
  JSONNode globalInfoNode;
  string *param_1_local;
  CentralizedFileFormat *this_local;
  
  GlobalInfoToJSON((CentralizedFileFormat *)&fieldsTableNode);
  FieldsTable::TableToJSON((FieldsTable *)local_28);
  OffsetTable::TableToJSON((OffsetTable *)&mainNode);
  ::JSONNode::JSONNode(&local_48,'\x05');
  ::JSONNode::push_back(&local_48,&fieldsTableNode);
  ::JSONNode::push_back(&local_48,(JSONNode *)local_28);
  ::JSONNode::push_back(&local_48,&mainNode);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_248,pcVar1,_S_out);
  ::JSONNode::write_formatted_abi_cxx11_(&local_268,&local_48,0x800);
  poVar2 = std::operator<<(local_248,(string *)&local_268);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_268);
  std::ofstream::close();
  std::ofstream::~ofstream(local_248);
  ::JSONNode::~JSONNode(&local_48);
  ::JSONNode::~JSONNode(&mainNode);
  ::JSONNode::~JSONNode((JSONNode *)local_28);
  ::JSONNode::~JSONNode(&fieldsTableNode);
  return;
}

Assistant:

void CentralizedFileFormat::WriteTables(const std::string&)
{
    // Discard fieldName, as both tables are written completely onto the file

    JSONNode globalInfoNode = GlobalInfoToJSON();
    JSONNode fieldsTableNode = pFieldsTable_->TableToJSON();
    JSONNode offsetTableNode = pOffsetTable_->TableToJSON();

    JSONNode mainNode;
    mainNode.push_back(globalInfoNode);
    mainNode.push_back(fieldsTableNode);
    mainNode.push_back(offsetTableNode);

    std::ofstream fs(databaseFile_.c_str());
    fs << mainNode.write_formatted() << "\n";
    fs.close();
}